

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueCallbacks.h
# Opt level: O1

shared_ptr<BER_CONTAINER> __thiscall
StaticIntegerCallback::buildTypeWithValue(StaticIntegerCallback *this)

{
  undefined4 uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  SortableOIDType *pSVar2;
  long in_RSI;
  shared_ptr<BER_CONTAINER> sVar3;
  
  pSVar2 = (SortableOIDType *)operator_new(0x28);
  (pSVar2->super_OIDType).super_BER_CONTAINER._type = 1;
  (pSVar2->super_OIDType).super_BER_CONTAINER._length = 1;
  (pSVar2->super_OIDType).super_BER_CONTAINER._vptr_BER_CONTAINER =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_001a2dd0;
  uVar1 = *(undefined4 *)(in_RSI + 0x18);
  (pSVar2->super_OIDType)._value._M_dataplus._M_p = (pointer)0x2;
  *(undefined ***)&(pSVar2->super_OIDType).valid = &PTR__BER_CONTAINER_001a45f0;
  *(undefined4 *)&(pSVar2->super_OIDType)._value._M_string_length = uVar1;
  (this->super_ValueCallback)._vptr_ValueCallback = (_func_int **)&(pSVar2->super_OIDType).valid;
  (this->super_ValueCallback).OID = pSVar2;
  sVar3.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
       uVar1;
  sVar3.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  sVar3.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 0;
  return (shared_ptr<BER_CONTAINER>)
         sVar3.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<BER_CONTAINER> buildTypeWithValue() override {
        return std::make_shared<IntegerType>(val);
    }